

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-sampling.cpp
# Opt level: O2

llama_sampler *
llama_sampler_init_penalties
          (int32_t penalty_last_n,float penalty_repeat,float penalty_freq,float penalty_present)

{
  undefined4 *ctx;
  llama_sampler *plVar1;
  size_t cap;
  
  cap = 0;
  if (0 < penalty_last_n) {
    cap = (size_t)(uint)penalty_last_n;
  }
  ctx = (undefined4 *)operator_new(0x80);
  *ctx = (int)cap;
  ctx[1] = penalty_repeat;
  ctx[2] = penalty_freq;
  ctx[3] = penalty_present;
  ring_buffer<int>::ring_buffer((ring_buffer<int> *)(ctx + 4),cap);
  *(undefined8 *)(ctx + 0x1a) = 0;
  *(undefined4 **)(ctx + 0x12) = ctx + 0x1e;
  *(undefined8 *)(ctx + 0x14) = 1;
  *(undefined8 *)(ctx + 0x16) = 0;
  *(undefined8 *)(ctx + 0x18) = 0;
  ctx[0x1a] = 0x3f800000;
  *(undefined8 *)(ctx + 0x1c) = 0;
  *(undefined8 *)(ctx + 0x1e) = 0;
  plVar1 = llama_sampler_init(&llama_sampler_penalties_i,ctx);
  return plVar1;
}

Assistant:

struct llama_sampler * llama_sampler_init_penalties(
        int32_t penalty_last_n,
        float penalty_repeat,
        float penalty_freq,
        float penalty_present) {
    penalty_last_n = std::max(penalty_last_n, 0);

    return llama_sampler_init(
        /* .iface = */ &llama_sampler_penalties_i,
        /* .ctx   = */ new llama_sampler_penalties {
            /* .penalty_last_n  = */ penalty_last_n,
            /* .penalty_repeat  = */ penalty_repeat,
            /* .penalty_freq    = */ penalty_freq,
            /* .penalty_present = */ penalty_present,
            /* .prev            = */ ring_buffer<llama_token>(penalty_last_n),
            /* .token_count     = */ {},
        }
    );
}